

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_reserved_keyword_set_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  undefined1 local_1169;
  undefined1 local_1168;
  undefined1 local_1167;
  allocator local_1166;
  allocator local_1165;
  allocator local_1164;
  allocator local_1163;
  allocator local_1162;
  allocator local_1161;
  allocator local_1160;
  allocator local_115f;
  allocator local_115e;
  allocator local_115d;
  allocator local_115c;
  allocator local_115b;
  allocator local_115a;
  allocator local_1159;
  allocator local_1158;
  allocator local_1157;
  allocator local_1156;
  allocator local_1155;
  allocator local_1154;
  allocator local_1153;
  allocator local_1152;
  allocator local_1151;
  allocator local_1150;
  allocator local_114f;
  allocator local_114e;
  allocator local_114d;
  allocator local_114c;
  allocator local_114b;
  allocator local_114a;
  allocator local_1149;
  allocator local_1148;
  allocator local_1147;
  allocator local_1146;
  allocator local_1145;
  allocator local_1144;
  allocator local_1143;
  allocator local_1142;
  allocator local_1141;
  allocator local_1140;
  allocator local_113f;
  allocator local_113e;
  allocator local_113d;
  allocator local_113c;
  allocator local_113b;
  allocator local_113a;
  allocator local_1139;
  allocator local_1138;
  allocator local_1137;
  allocator local_1136;
  allocator local_1135;
  allocator local_1134;
  allocator local_1133;
  allocator local_1132;
  allocator local_1131;
  allocator local_1130;
  allocator local_112f;
  allocator local_112e;
  allocator local_112d;
  allocator local_112c;
  allocator local_112b;
  allocator local_112a;
  allocator local_1129;
  allocator local_1128;
  allocator local_1127;
  allocator local_1126;
  allocator local_1125;
  allocator local_1124;
  allocator local_1123;
  allocator local_1122;
  allocator local_1121;
  allocator local_1120;
  allocator local_111f;
  allocator local_111e;
  allocator local_111d;
  allocator local_111c;
  allocator local_111b;
  allocator local_111a;
  allocator local_1119;
  allocator local_1118;
  allocator local_1117;
  allocator local_1116;
  allocator local_1115;
  allocator local_1114;
  allocator local_1113;
  allocator local_1112;
  allocator local_1111;
  allocator local_1110;
  allocator local_110f;
  allocator local_110e;
  allocator local_110d;
  allocator local_110c;
  allocator local_110b;
  allocator local_110a;
  allocator local_1109;
  allocator local_1108;
  allocator local_1107;
  allocator local_1106;
  allocator local_1105;
  allocator local_1104;
  allocator local_1103;
  allocator local_1102;
  allocator local_1101;
  allocator local_1100;
  allocator local_10ff;
  allocator local_10fe;
  allocator local_10fd;
  allocator local_10fc;
  allocator local_10fb;
  allocator local_10fa;
  allocator local_10f9;
  allocator local_10f8;
  allocator local_10f7;
  allocator local_10f6;
  allocator local_10f5;
  allocator local_10f4;
  allocator local_10f3;
  allocator local_10f2;
  allocator local_10f1;
  allocator local_10f0;
  allocator local_10ef;
  allocator local_10ee;
  allocator local_10ed;
  allocator local_10ec;
  allocator local_10eb;
  allocator local_10ea;
  allocator local_10e9;
  allocator local_10e8;
  allocator local_10e7;
  allocator local_10e6;
  allocator local_10e5;
  allocator local_10e4;
  allocator local_10e3;
  allocator local_10e2;
  allocator local_10e1;
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::__cxx11::string::string(local_10e0,"kernel",&local_10e1);
      ::std::__cxx11::string::string(local_10c0,"vertex",&local_10e2);
      ::std::__cxx11::string::string(local_10a0,"fragment",&local_10e3);
      ::std::__cxx11::string::string(local_1080,"compute",&local_10e4);
      ::std::__cxx11::string::string(local_1060,"constant",&local_10e5);
      ::std::__cxx11::string::string(local_1040,"device",&local_10e6);
      ::std::__cxx11::string::string(local_1020,"bias",&local_10e7);
      ::std::__cxx11::string::string(local_1000,"level",&local_10e8);
      ::std::__cxx11::string::string(local_fe0,"gradient2d",&local_10e9);
      ::std::__cxx11::string::string(local_fc0,"gradientcube",&local_10ea);
      ::std::__cxx11::string::string(local_fa0,"gradient3d",&local_10eb);
      ::std::__cxx11::string::string(local_f80,"min_lod_clamp",&local_10ec);
      ::std::__cxx11::string::string(local_f60,"assert",&local_10ed);
      ::std::__cxx11::string::string(local_f40,"VARIABLE_TRACEPOINT",&local_10ee);
      ::std::__cxx11::string::string(local_f20,"STATIC_DATA_TRACEPOINT",&local_10ef);
      ::std::__cxx11::string::string(local_f00,"STATIC_DATA_TRACEPOINT_V",&local_10f0);
      ::std::__cxx11::string::string(local_ee0,"METAL_ALIGN",&local_10f1);
      ::std::__cxx11::string::string(local_ec0,"METAL_ASM",&local_10f2);
      ::std::__cxx11::string::string(local_ea0,"METAL_CONST",&local_10f3);
      ::std::__cxx11::string::string(local_e80,"METAL_DEPRECATED",&local_10f4);
      ::std::__cxx11::string::string(local_e60,"METAL_ENABLE_IF",&local_10f5);
      ::std::__cxx11::string::string(local_e40,"METAL_FUNC",&local_10f6);
      ::std::__cxx11::string::string(local_e20,"METAL_INTERNAL",&local_10f7);
      ::std::__cxx11::string::string(local_e00,"METAL_NON_NULL_RETURN",&local_10f8);
      ::std::__cxx11::string::string(local_de0,"METAL_NORETURN",&local_10f9);
      ::std::__cxx11::string::string(local_dc0,"METAL_NOTHROW",&local_10fa);
      ::std::__cxx11::string::string(local_da0,"METAL_PURE",&local_10fb);
      ::std::__cxx11::string::string(local_d80,"METAL_UNAVAILABLE",&local_10fc);
      ::std::__cxx11::string::string(local_d60,"METAL_IMPLICIT",&local_10fd);
      ::std::__cxx11::string::string(local_d40,"METAL_EXPLICIT",&local_10fe);
      ::std::__cxx11::string::string(local_d20,"METAL_CONST_ARG",&local_10ff);
      ::std::__cxx11::string::string(local_d00,"METAL_ARG_UNIFORM",&local_1100);
      ::std::__cxx11::string::string(local_ce0,"METAL_ZERO_ARG",&local_1101);
      ::std::__cxx11::string::string(local_cc0,"METAL_VALID_LOD_ARG",&local_1102);
      ::std::__cxx11::string::string(local_ca0,"METAL_VALID_LEVEL_ARG",&local_1103);
      ::std::__cxx11::string::string(local_c80,"METAL_VALID_STORE_ORDER",&local_1104);
      ::std::__cxx11::string::string(local_c60,"METAL_VALID_LOAD_ORDER",&local_1105);
      ::std::__cxx11::string::string
                (local_c40,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",&local_1106);
      ::std::__cxx11::string::string
                (local_c20,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",&local_1107);
      ::std::__cxx11::string::string(local_c00,"METAL_VALID_RENDER_TARGET",&local_1108);
      ::std::__cxx11::string::string(local_be0,"is_function_constant_defined",&local_1109);
      ::std::__cxx11::string::string(local_bc0,"CHAR_BIT",&local_110a);
      ::std::__cxx11::string::string(local_ba0,"SCHAR_MAX",&local_110b);
      ::std::__cxx11::string::string(local_b80,"SCHAR_MIN",&local_110c);
      ::std::__cxx11::string::string(local_b60,"UCHAR_MAX",&local_110d);
      ::std::__cxx11::string::string(local_b40,"CHAR_MAX",&local_110e);
      ::std::__cxx11::string::string(local_b20,"CHAR_MIN",&local_110f);
      ::std::__cxx11::string::string(local_b00,"USHRT_MAX",&local_1110);
      ::std::__cxx11::string::string(local_ae0,"SHRT_MAX",&local_1111);
      ::std::__cxx11::string::string(local_ac0,"SHRT_MIN",&local_1112);
      ::std::__cxx11::string::string(local_aa0,"UINT_MAX",&local_1113);
      ::std::__cxx11::string::string(local_a80,"INT_MAX",&local_1114);
      ::std::__cxx11::string::string(local_a60,"INT_MIN",&local_1115);
      ::std::__cxx11::string::string(local_a40,"FLT_DIG",&local_1116);
      ::std::__cxx11::string::string(local_a20,"FLT_MANT_DIG",&local_1117);
      ::std::__cxx11::string::string(local_a00,"FLT_MAX_10_EXP",&local_1118);
      ::std::__cxx11::string::string(local_9e0,"FLT_MAX_EXP",&local_1119);
      ::std::__cxx11::string::string(local_9c0,"FLT_MIN_10_EXP",&local_111a);
      ::std::__cxx11::string::string(local_9a0,"FLT_MIN_EXP",&local_111b);
      ::std::__cxx11::string::string(local_980,"FLT_RADIX",&local_111c);
      ::std::__cxx11::string::string(local_960,"FLT_MAX",&local_111d);
      ::std::__cxx11::string::string(local_940,"FLT_MIN",&local_111e);
      ::std::__cxx11::string::string(local_920,"FLT_EPSILON",&local_111f);
      ::std::__cxx11::string::string(local_900,"FP_ILOGB0",&local_1120);
      ::std::__cxx11::string::string(local_8e0,"FP_ILOGBNAN",&local_1121);
      ::std::__cxx11::string::string(local_8c0,"MAXFLOAT",&local_1122);
      ::std::__cxx11::string::string(local_8a0,"HUGE_VALF",&local_1123);
      ::std::__cxx11::string::string(local_880,"INFINITY",&local_1124);
      ::std::__cxx11::string::string(local_860,"NAN",&local_1125);
      ::std::__cxx11::string::string(local_840,"M_E_F",&local_1126);
      ::std::__cxx11::string::string(local_820,"M_LOG2E_F",&local_1127);
      ::std::__cxx11::string::string(local_800,"M_LOG10E_F",&local_1128);
      ::std::__cxx11::string::string(local_7e0,"M_LN2_F",&local_1129);
      ::std::__cxx11::string::string(local_7c0,"M_LN10_F",&local_112a);
      ::std::__cxx11::string::string(local_7a0,"M_PI_F",&local_112b);
      ::std::__cxx11::string::string(local_780,"M_PI_2_F",&local_112c);
      ::std::__cxx11::string::string(local_760,"M_PI_4_F",&local_112d);
      ::std::__cxx11::string::string(local_740,"M_1_PI_F",&local_112e);
      ::std::__cxx11::string::string(local_720,"M_2_PI_F",&local_112f);
      ::std::__cxx11::string::string(local_700,"M_2_SQRTPI_F",&local_1130);
      ::std::__cxx11::string::string(local_6e0,"M_SQRT2_F",&local_1131);
      ::std::__cxx11::string::string(local_6c0,"M_SQRT1_2_F",&local_1132);
      ::std::__cxx11::string::string(local_6a0,"HALF_DIG",&local_1133);
      ::std::__cxx11::string::string(local_680,"HALF_MANT_DIG",&local_1134);
      ::std::__cxx11::string::string(local_660,"HALF_MAX_10_EXP",&local_1135);
      ::std::__cxx11::string::string(local_640,"HALF_MAX_EXP",&local_1136);
      ::std::__cxx11::string::string(local_620,"HALF_MIN_10_EXP",&local_1137);
      ::std::__cxx11::string::string(local_600,"HALF_MIN_EXP",&local_1138);
      ::std::__cxx11::string::string(local_5e0,"HALF_RADIX",&local_1139);
      ::std::__cxx11::string::string(local_5c0,"HALF_MAX",&local_113a);
      ::std::__cxx11::string::string(local_5a0,"HALF_MIN",&local_113b);
      ::std::__cxx11::string::string(local_580,"HALF_EPSILON",&local_113c);
      ::std::__cxx11::string::string(local_560,"MAXHALF",&local_113d);
      ::std::__cxx11::string::string(local_540,"HUGE_VALH",&local_113e);
      ::std::__cxx11::string::string(local_520,"M_E_H",&local_113f);
      ::std::__cxx11::string::string(local_500,"M_LOG2E_H",&local_1140);
      ::std::__cxx11::string::string(local_4e0,"M_LOG10E_H",&local_1141);
      ::std::__cxx11::string::string(local_4c0,"M_LN2_H",&local_1142);
      ::std::__cxx11::string::string(local_4a0,"M_LN10_H",&local_1143);
      ::std::__cxx11::string::string(local_480,"M_PI_H",&local_1144);
      ::std::__cxx11::string::string(local_460,"M_PI_2_H",&local_1145);
      ::std::__cxx11::string::string(local_440,"M_PI_4_H",&local_1146);
      ::std::__cxx11::string::string(local_420,"M_1_PI_H",&local_1147);
      ::std::__cxx11::string::string(local_400,"M_2_PI_H",&local_1148);
      ::std::__cxx11::string::string(local_3e0,"M_2_SQRTPI_H",&local_1149);
      ::std::__cxx11::string::string(local_3c0,"M_SQRT2_H",&local_114a);
      ::std::__cxx11::string::string(local_3a0,"M_SQRT1_2_H",&local_114b);
      ::std::__cxx11::string::string(local_380,"DBL_DIG",&local_114c);
      ::std::__cxx11::string::string(local_360,"DBL_MANT_DIG",&local_114d);
      ::std::__cxx11::string::string(local_340,"DBL_MAX_10_EXP",&local_114e);
      ::std::__cxx11::string::string(local_320,"DBL_MAX_EXP",&local_114f);
      ::std::__cxx11::string::string(local_300,"DBL_MIN_10_EXP",&local_1150);
      ::std::__cxx11::string::string(local_2e0,"DBL_MIN_EXP",&local_1151);
      ::std::__cxx11::string::string(local_2c0,"DBL_RADIX",&local_1152);
      ::std::__cxx11::string::string(local_2a0,"DBL_MAX",&local_1153);
      ::std::__cxx11::string::string(local_280,"DBL_MIN",&local_1154);
      ::std::__cxx11::string::string(local_260,"DBL_EPSILON",&local_1155);
      ::std::__cxx11::string::string(local_240,"HUGE_VAL",&local_1156);
      ::std::__cxx11::string::string(local_220,"M_E",&local_1157);
      ::std::__cxx11::string::string(local_200,"M_LOG2E",&local_1158);
      ::std::__cxx11::string::string(local_1e0,"M_LOG10E",&local_1159);
      ::std::__cxx11::string::string(local_1c0,"M_LN2",&local_115a);
      ::std::__cxx11::string::string(local_1a0,"M_LN10",&local_115b);
      ::std::__cxx11::string::string(local_180,"M_PI",&local_115c);
      ::std::__cxx11::string::string(local_160,"M_PI_2",&local_115d);
      ::std::__cxx11::string::string(local_140,"M_PI_4",&local_115e);
      ::std::__cxx11::string::string(local_120,"M_1_PI",&local_115f);
      ::std::__cxx11::string::string(local_100,"M_2_PI",&local_1160);
      ::std::__cxx11::string::string(local_e0,"M_2_SQRTPI",&local_1161);
      ::std::__cxx11::string::string(local_c0,"M_SQRT2",&local_1162);
      ::std::__cxx11::string::string(local_a0,"M_SQRT1_2",&local_1163);
      ::std::__cxx11::string::string(local_80,"quad_broadcast",&local_1164);
      ::std::__cxx11::string::string(local_60,"thread",&local_1165);
      ::std::__cxx11::string::string(local_40,"threadgroup",&local_1166);
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_,local_10e0,
                 &stack0xffffffffffffffe0,0,&local_1167,&local_1168,&local_1169);
      lVar2 = 0x10a0;
      do {
        ::std::__cxx11::string::~string(local_10e0 + lVar2);
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_);
    }
  }
  return &get_reserved_keyword_set[abi:cxx11]()::keywords_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_reserved_keyword_set()
{
	static const unordered_set<string> keywords = {
		"kernel",
		"vertex",
		"fragment",
		"compute",
		"constant",
		"device",
		"bias",
		"level",
		"gradient2d",
		"gradientcube",
		"gradient3d",
		"min_lod_clamp",
		"assert",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
		"quad_broadcast",
		"thread",
		"threadgroup",
	};

	return keywords;
}